

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

int BN_mask_bits(BIGNUM *a,int n)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 0;
  if (-1 < n) {
    uVar1 = (uint)n >> 6;
    if ((int)uVar1 < a->top) {
      if ((n & 0x3fU) == 0) {
        a->top = uVar1;
      }
      else {
        a->top = uVar1 + 1;
        a->d[uVar1] = a->d[uVar1] & ~(-1L << (sbyte)(n & 0x3fU));
      }
      lVar2 = (long)a->top;
      if (0 < lVar2) {
        iVar3 = a->top + 1;
        do {
          if (a->d[lVar2 + -1] != 0) goto LAB_00112c81;
          lVar2 = lVar2 + -1;
          iVar3 = iVar3 + -1;
        } while (1 < iVar3);
        lVar2 = 0;
LAB_00112c81:
        a->top = (int)lVar2;
      }
      iVar3 = 1;
      if (a->top == 0) {
        a->neg = 0;
        return iVar3;
      }
    }
  }
  return iVar3;
}

Assistant:

int BN_mask_bits(BIGNUM *a, int n)
{
    int b, w;

    bn_check_top(a);
    if (n < 0)
        return 0;

    w = n / BN_BITS2;
    b = n % BN_BITS2;
    if (w >= a->top)
        return 0;
    if (b == 0)
        a->top = w;
    else {
        a->top = w + 1;
        a->d[w] &= ~(BN_MASK2 << b);
    }
    bn_correct_top(a);
    return (1);
}